

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader-compiler.c
# Opt level: O0

void print_ast_datatype(FILE *io,MOJOSHADER_astDataType *dt)

{
  int local_1c;
  int i;
  MOJOSHADER_astDataType *dt_local;
  FILE *io_local;
  
  if (dt != (MOJOSHADER_astDataType *)0x0) {
    switch(dt->type) {
    case MOJOSHADER_AST_DATATYPE_BOOL:
      fprintf((FILE *)io,"bool");
      break;
    case MOJOSHADER_AST_DATATYPE_INT:
      fprintf((FILE *)io,"int");
      break;
    case MOJOSHADER_AST_DATATYPE_UINT:
      fprintf((FILE *)io,"uint");
      break;
    case MOJOSHADER_AST_DATATYPE_FLOAT:
      fprintf((FILE *)io,"float");
      break;
    case MOJOSHADER_AST_DATATYPE_FLOAT_SNORM:
      fprintf((FILE *)io,"snorm float");
      break;
    case MOJOSHADER_AST_DATATYPE_FLOAT_UNORM:
      fprintf((FILE *)io,"unorm float");
      break;
    case MOJOSHADER_AST_DATATYPE_HALF:
      fprintf((FILE *)io,"half");
      break;
    case MOJOSHADER_AST_DATATYPE_DOUBLE:
      fprintf((FILE *)io,"double");
      break;
    case MOJOSHADER_AST_DATATYPE_STRING:
      fprintf((FILE *)io,"string");
      break;
    case MOJOSHADER_AST_DATATYPE_SAMPLER_1D:
      fprintf((FILE *)io,"sampler1D");
      break;
    case MOJOSHADER_AST_DATATYPE_SAMPLER_2D:
      fprintf((FILE *)io,"sampler2D");
      break;
    case MOJOSHADER_AST_DATATYPE_SAMPLER_3D:
      fprintf((FILE *)io,"sampler3D");
      break;
    case MOJOSHADER_AST_DATATYPE_SAMPLER_CUBE:
      fprintf((FILE *)io,"samplerCUBE");
      break;
    case MOJOSHADER_AST_DATATYPE_SAMPLER_STATE:
      fprintf((FILE *)io,"sampler_state");
      break;
    case MOJOSHADER_AST_DATATYPE_SAMPLER_COMPARISON_STATE:
      fprintf((FILE *)io,"SamplerComparisonState");
      break;
    case MOJOSHADER_AST_DATATYPE_STRUCT:
      fprintf((FILE *)io,"struct { ");
      for (local_1c = 0; local_1c < (dt->array).elements; local_1c = local_1c + 1) {
        print_ast_datatype(io,*(MOJOSHADER_astDataType **)
                               ((long)(dt->array).base + (long)local_1c * 0x10));
        fprintf((FILE *)io," %s; ",
                *(undefined8 *)((long)(dt->array).base + (long)local_1c * 0x10 + 8));
      }
      fprintf((FILE *)io,"}");
      break;
    case MOJOSHADER_AST_DATATYPE_ARRAY:
      print_ast_datatype(io,(dt->array).base);
      if ((dt->array).elements < 0) {
        fprintf((FILE *)io,"[]");
      }
      else {
        fprintf((FILE *)io,"[%d]",(ulong)(uint)(dt->array).elements);
      }
      break;
    case MOJOSHADER_AST_DATATYPE_VECTOR:
      fprintf((FILE *)io,"vector<");
      print_ast_datatype(io,(dt->array).base);
      fprintf((FILE *)io,",%d>",(ulong)(uint)(dt->array).elements);
      break;
    case MOJOSHADER_AST_DATATYPE_MATRIX:
      fprintf((FILE *)io,"matrix<");
      print_ast_datatype(io,(dt->array).base);
      fprintf((FILE *)io,",%d,%d>",(ulong)(uint)(dt->array).elements,
              (ulong)(uint)(dt->matrix).columns);
      break;
    case MOJOSHADER_AST_DATATYPE_BUFFER:
      fprintf((FILE *)io,"buffer<");
      print_ast_datatype(io,(dt->array).base);
      fprintf((FILE *)io,">");
      break;
    case MOJOSHADER_AST_DATATYPE_FUNCTION:
      if ((dt->array).base == (MOJOSHADER_astDataType *)0x0) {
        fprintf((FILE *)io,"void");
      }
      else {
        print_ast_datatype(io,(dt->array).base);
      }
      break;
    case MOJOSHADER_AST_DATATYPE_USER:
      fprintf((FILE *)io,"%s",(dt->user).name);
      break;
    default:
      __assert_fail("0 && \"Unexpected datatype.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/utils/mojoshader-compiler.c"
                    ,0xb9,"void print_ast_datatype(FILE *, const MOJOSHADER_astDataType *)");
    }
  }
  return;
}

Assistant:

static void print_ast_datatype(FILE *io, const MOJOSHADER_astDataType *dt)
{
    int i;

    if (dt == NULL)
        return;

    switch (dt->type)
    {
        case MOJOSHADER_AST_DATATYPE_BOOL:
            fprintf(io, "bool");
            return;
        case MOJOSHADER_AST_DATATYPE_INT:
            fprintf(io, "int");
            return;
        case MOJOSHADER_AST_DATATYPE_UINT:
            fprintf(io, "uint");
            return;
        case MOJOSHADER_AST_DATATYPE_FLOAT:
            fprintf(io, "float");
            return;
        case MOJOSHADER_AST_DATATYPE_FLOAT_SNORM:
            fprintf(io, "snorm float");
            return;
        case MOJOSHADER_AST_DATATYPE_FLOAT_UNORM:
            fprintf(io, "unorm float");
            return;
        case MOJOSHADER_AST_DATATYPE_HALF:
            fprintf(io, "half");
            return;
        case MOJOSHADER_AST_DATATYPE_DOUBLE:
            fprintf(io, "double");
            return;
        case MOJOSHADER_AST_DATATYPE_STRING:
            fprintf(io, "string");
            return;
        case MOJOSHADER_AST_DATATYPE_SAMPLER_1D:
            fprintf(io, "sampler1D");
            return;
        case MOJOSHADER_AST_DATATYPE_SAMPLER_2D:
            fprintf(io, "sampler2D");
            return;
        case MOJOSHADER_AST_DATATYPE_SAMPLER_3D:
            fprintf(io, "sampler3D");
            return;
        case MOJOSHADER_AST_DATATYPE_SAMPLER_CUBE:
            fprintf(io, "samplerCUBE");
            return;
        case MOJOSHADER_AST_DATATYPE_SAMPLER_STATE:
            fprintf(io, "sampler_state");
            return;
        case MOJOSHADER_AST_DATATYPE_SAMPLER_COMPARISON_STATE:
            fprintf(io, "SamplerComparisonState");
            return;

        case MOJOSHADER_AST_DATATYPE_STRUCT:
            fprintf(io, "struct { ");
            for (i = 0; i < dt->structure.member_count; i++)
            {
                print_ast_datatype(io, dt->structure.members[i].datatype);
                fprintf(io, " %s; ", dt->structure.members[i].identifier);
            } // for
            fprintf(io, "}");
            return;

        case MOJOSHADER_AST_DATATYPE_ARRAY:
            print_ast_datatype(io, dt->array.base);
            if (dt->array.elements < 0)
                fprintf(io, "[]");
            else
                fprintf(io, "[%d]", dt->array.elements);
            return;

        case MOJOSHADER_AST_DATATYPE_VECTOR:
            fprintf(io, "vector<");
            print_ast_datatype(io, dt->vector.base);
            fprintf(io, ",%d>", dt->vector.elements);
            return;

        case MOJOSHADER_AST_DATATYPE_MATRIX:
            fprintf(io, "matrix<");
            print_ast_datatype(io, dt->matrix.base);
            fprintf(io, ",%d,%d>", dt->matrix.rows, dt->matrix.columns);
            return;

        case MOJOSHADER_AST_DATATYPE_BUFFER:
            fprintf(io, "buffer<");
            print_ast_datatype(io, dt->buffer.base);
            fprintf(io, ">");
            return;

        case MOJOSHADER_AST_DATATYPE_USER:
            fprintf(io, "%s", dt->user.name);
            return;

        // this should only appear if we did semantic analysis on the AST,
        //  so we only print the return value here.
        case MOJOSHADER_AST_DATATYPE_FUNCTION:
            if (!dt->function.retval)
                fprintf(io, "void");
            else
                print_ast_datatype(io, dt->function.retval);
            return;

        //case MOJOSHADER_AST_DATATYPE_NONE:
        default:
            assert(0 && "Unexpected datatype.");
            return;
    } // switch
}